

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,Bridges *bridges)

{
  LightEdge *pLVar1;
  LightEdge *e;
  LightEdge *e_00;
  
  pLVar1 = (bridges->super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (e_00 = (bridges->super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>).
              _M_impl.super__Vector_impl_data._M_start; e_00 != pLVar1; e_00 = e_00 + 1) {
    operator<<(stream,e_00);
    std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
  }
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph::Bridges &bridges) {
    for (auto &e : bridges)
        stream << e << " ";
    return stream;
}